

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wait_children_dep.cpp
# Opt level: O0

void g(int *i)

{
  ostream *poVar1;
  int *in_RDI;
  rep_conflict rVar2;
  scoped_lock l_1;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffff48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffff60;
  duration<double,_std::ratio<1L,_1L>_> local_48 [2];
  undefined8 local_38;
  rep local_30;
  duration<double,_std::ratio<1L,_1L>_> local_28 [4];
  int *local_8;
  
  local_8 = in_RDI;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  poVar1 = std::operator<<((ostream *)&std::cerr,"g begin: ");
  local_38 = std::chrono::_V2::system_clock::now();
  local_30 = (rep)std::chrono::operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x11fcb8);
  *local_8 = *local_8 + 1;
  spin_mutex_t::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  poVar1 = std::operator<<((ostream *)&std::cerr,"g finish: ");
  std::chrono::_V2::system_clock::now();
  std::chrono::operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->__d);
  rVar2 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_48);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2);
  poVar1 = std::operator<<(poVar1," with i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x11fda6);
  return;
}

Assistant:

void g(int &i) {  
  LOG("g begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i++;
  
  LOG("g finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}